

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

void __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::~RTPHashTable(RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
                *this)

{
  RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
  *this_local;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPHashTable_001ae560;
  Clear(this);
  RTPMemoryObject::~RTPMemoryObject(&this->super_RTPMemoryObject);
  return;
}

Assistant:

~RTPHashTable()						{ Clear(); }